

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

SliceDynamicLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_slicedynamic(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 1000) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 1000;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x88);
    SliceDynamicLayerParams::SliceDynamicLayerParams(this_00.slicedynamic_);
    (this->layer_).slicedynamic_ = (SliceDynamicLayerParams *)this_00;
  }
  return (SliceDynamicLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::SliceDynamicLayerParams* NeuralNetworkLayer::mutable_slicedynamic() {
  if (!has_slicedynamic()) {
    clear_layer();
    set_has_slicedynamic();
    layer_.slicedynamic_ = new ::CoreML::Specification::SliceDynamicLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.sliceDynamic)
  return layer_.slicedynamic_;
}